

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O3

void Msat_SolverSort(Msat_Clause_t **array,int size,double seed)

{
  Msat_Clause_t **ppMVar1;
  Msat_Clause_t *pC;
  Msat_Clause_t *pMVar2;
  Msat_Clause_t **array_00;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int size_00;
  long lVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  
  array_00 = array;
  if (0xf < size) {
    do {
      uVar5 = size;
      pC = array_00[(int)((double)(int)uVar5 * 0.38433611597136413)];
      lVar6 = -1;
      uVar4 = (ulong)uVar5;
      while( true ) {
        lVar6 = (long)(int)lVar6;
        array = array_00 + lVar6;
        do {
          lVar6 = lVar6 + 1;
          ppMVar1 = array + 1;
          array = array + 1;
          fVar7 = Msat_ClauseReadActivity(*ppMVar1);
          fVar8 = Msat_ClauseReadActivity(pC);
        } while (fVar7 < fVar8);
        uVar3 = (long)(int)uVar4;
        do {
          uVar4 = uVar3 - 1;
          fVar7 = Msat_ClauseReadActivity(pC);
          fVar8 = Msat_ClauseReadActivity(array_00[uVar3 - 1]);
          uVar3 = uVar4;
        } while (fVar7 < fVar8);
        if ((long)uVar4 <= lVar6) break;
        pMVar2 = *array;
        *array = array_00[uVar4];
        array_00[uVar4] = pMVar2;
      }
      size_00 = (int)lVar6;
      Msat_SolverSort(array_00,size_00,(double)CONCAT44(extraout_XMM0_Db,fVar8));
      array_00 = array;
      size = uVar5 - size_00;
    } while (0xf < (int)(uVar5 - size_00));
    size = uVar5 - size_00;
  }
  Msat_SolverSortSelection(array,size);
  return;
}

Assistant:

void Msat_SolverSort( Msat_Clause_t ** array, int size, double seed )
{
    if (size <= 15)
        Msat_SolverSortSelection( array, size );
    else
    {
        Msat_Clause_t *   pivot = array[irand(seed, size)];
        Msat_Clause_t *   tmp;
        int              i = -1;
        int              j = size;

        for(;;)
        {
            do i++; while( Msat_ClauseReadActivity(array[i]) < Msat_ClauseReadActivity(pivot) );
            do j--; while( Msat_ClauseReadActivity(pivot) < Msat_ClauseReadActivity(array[j]) );

            if ( i >= j ) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        Msat_SolverSort(array    , i     , seed);
        Msat_SolverSort(&array[i], size-i, seed);
    }
}